

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::DocEnd(void)

{
  int iVar1;
  RegEx *in_stack_ffffffffffffff80;
  RegEx *in_stack_ffffffffffffff88;
  REGEX_OP in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  RegEx *in_stack_ffffffffffffffa0;
  allocator local_41;
  string local_40 [64];
  
  if (DocEnd()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&DocEnd()::e);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"...",&local_41);
      RegEx::RegEx(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      BlankOrBreak();
      RegEx::RegEx((RegEx *)0xf17191);
      operator|(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      YAML::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      RegEx::~RegEx((RegEx *)0xf171cd);
      RegEx::~RegEx((RegEx *)0xf171d7);
      RegEx::~RegEx((RegEx *)0xf171e4);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      __cxa_atexit(RegEx::~RegEx,&DocEnd::e,&__dso_handle);
      __cxa_guard_release(&DocEnd()::e);
    }
  }
  return &DocEnd::e;
}

Assistant:

inline const RegEx& DocEnd() {
  static const RegEx e = RegEx("...") + (BlankOrBreak() | RegEx());
  return e;
}